

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

GoniometricLight *
pbrt::GoniometricLight::Create
          (Transform *renderFromLight,MediumHandle *medium,ParameterDictionary *parameters,
          RGBColorSpace *colorSpace,FileLoc *loc,Allocator alloc)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar1;
  undefined1 *puVar2;
  undefined1 auVar3 [16];
  Allocator AVar4;
  int iVar5;
  undefined8 uVar6;
  int iVar7;
  Float (*paFVar8) [4];
  undefined4 extraout_var;
  ulong uVar9;
  uint uVar10;
  Float (*paFVar11) [4];
  Point2i PVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  Float FVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [64];
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM3_Da;
  undefined1 in_register_000012c4 [12];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  Float sc;
  long local_5a0;
  Allocator alloc_local;
  RGBColorSpace *imageColorSpace;
  SpectrumHandle I;
  ImageChannelDesc rgbDesc;
  string texname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  Transform finalRenderFromLight;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_418;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_410;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_3f0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_3d0;
  Image image;
  Transform t;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_1e8;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> local_1e0;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> local_1c0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1a0;
  ImageMetadata local_180;
  ImageChannelDesc yDesc;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_50;
  ColorEncodingHandle local_48;
  ColorEncodingHandle local_40;
  ulong local_38;
  
  t.m.m[0]._0_8_ = t.m.m + 1;
  alloc_local = alloc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&t,"I","");
  local_38 = (ulong)&colorSpace->illuminant | 0x2000000000000;
  ParameterDictionary::GetOneSpectrum
            ((ParameterDictionary *)&I,(string *)parameters,(SpectrumHandle *)&t,
             (SpectrumType)&local_38,(Allocator)0x1);
  if ((Float (*) [4])t.m.m[0]._0_8_ != t.m.m + 1) {
    operator_delete((void *)t.m.m[0]._0_8_,t.m.m[1]._0_8_ + 1);
  }
  t.m.m[0]._0_8_ = t.m.m + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&t,"scale","");
  sc = ParameterDictionary::GetOneFloat(parameters,(string *)&t,1.0);
  if ((Float (*) [4])t.m.m[0]._0_8_ != t.m.m + 1) {
    local_5a0 = CONCAT44(local_5a0._4_4_,sc);
    operator_delete((void *)t.m.m[0]._0_8_,t.m.m[1]._0_8_ + 1);
    sc = (Float)local_5a0;
  }
  AVar4.memoryResource = alloc_local.memoryResource;
  image.format = U256;
  image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  image.channelNames.alloc.memoryResource = pstd::pmr::new_delete_resource();
  image.channelNames.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  image.channelNames.nAlloc = 0;
  image.channelNames.nStored = 0;
  image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  image.p8.alloc.memoryResource = AVar4.memoryResource;
  image.p8.ptr = (uchar *)0x0;
  image.p8.nAlloc = 0;
  image.p8.nStored = 0;
  image.p16.alloc.memoryResource = AVar4.memoryResource;
  image.p16.ptr = (Half *)0x0;
  image.p16.nAlloc = 0;
  image.p16.nStored = 0;
  image.p32.alloc.memoryResource = AVar4.memoryResource;
  image.p32.ptr = (float *)0x0;
  image.p32.nAlloc = 0;
  image.p32.nStored = 0;
  imageColorSpace = (RGBColorSpace *)0x0;
  paFVar8 = finalRenderFromLight.m.m + 1;
  finalRenderFromLight.m.m[0]._0_8_ = paFVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&finalRenderFromLight,"filename","");
  paVar1 = &rgbDesc.offset.field_2;
  rgbDesc.offset.alloc.memoryResource = (memory_resource *)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rgbDesc,"");
  ParameterDictionary::GetOneString
            ((string *)&t,parameters,(string *)&finalRenderFromLight,(string *)&rgbDesc);
  ResolveFilename(&texname,(string *)&t);
  if ((Float (*) [4])t.m.m[0]._0_8_ != t.m.m + 1) {
    operator_delete((void *)t.m.m[0]._0_8_,t.m.m[1]._0_8_ + 1);
  }
  if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
       *)rgbDesc.offset.alloc.memoryResource != paVar1) {
    operator_delete(rgbDesc.offset.alloc.memoryResource,rgbDesc.offset.field_2._0_8_ + 1);
  }
  if ((Float (*) [4])finalRenderFromLight.m.m[0]._0_8_ != paFVar8) {
    operator_delete((void *)finalRenderFromLight.m.m[0]._0_8_,
                    CONCAT44(finalRenderFromLight.m.m[1][1],finalRenderFromLight.m.m[1][0]) + 1);
  }
  if (texname._M_string_length != 0) {
    local_40.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    Image::Read((ImageAndMetadata *)&t,&texname,alloc_local,&local_40);
    finalRenderFromLight.m.m[0]._0_8_ = paFVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&finalRenderFromLight,"R","");
    finalRenderFromLight.m.m[2]._0_8_ = finalRenderFromLight.m.m + 3;
    std::__cxx11::string::_M_construct<char_const*>((string *)(finalRenderFromLight.m.m + 2),"G","")
    ;
    paFVar11 = finalRenderFromLight.mInv.m + 1;
    finalRenderFromLight.mInv.m[0]._0_8_ = paFVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&finalRenderFromLight.mInv,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finalRenderFromLight;
    Image::GetChannelDesc(&rgbDesc,(Image *)&t,requestedChannels);
    lVar14 = -0x60;
    do {
      puVar2 = *(undefined1 **)((SquareMatrix<4> *)(paFVar11 + -1))->m[0];
      if (paFVar11 != (Float (*) [4])puVar2) {
        operator_delete(puVar2,*(long *)*paFVar11 + 1);
      }
      paFVar11 = paFVar11 + -2;
      lVar14 = lVar14 + 0x20;
    } while (lVar14 != 0);
    finalRenderFromLight.m.m[0]._0_8_ = paFVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&finalRenderFromLight,"Y","");
    requestedChannels_00.n = 1;
    requestedChannels_00.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&finalRenderFromLight;
    Image::GetChannelDesc(&yDesc,(Image *)&t,requestedChannels_00);
    if ((Float (*) [4])finalRenderFromLight.m.m[0]._0_8_ != paFVar8) {
      operator_delete((void *)finalRenderFromLight.m.m[0]._0_8_,
                      CONCAT44(finalRenderFromLight.m.m[1][1],finalRenderFromLight.m.m[1][0]) + 1);
    }
    imageColorSpace = ImageMetadata::GetColorSpace(&local_180);
    FVar16 = t.m.m[0][0];
    if (rgbDesc.offset.nStored == 0) {
      if (yDesc.offset.nStored == 0) {
        ErrorExit<std::__cxx11::string&>
                  (loc,"%s: has neither \"R\", \"G\", and \"B\" or \"Y\" channels.",&texname);
      }
      image.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)t.m.m[0][2];
      image._0_8_ = t.m.m[0]._0_8_;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&image.channelNames,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(t.m.m + 1));
      image.encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )local_1e8.bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&image.p8,&local_1e0);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&image.p16,&local_1c0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&image.p32,&local_1a0);
    }
    else {
      if (yDesc.offset.nStored != 0) {
        ErrorExit<std::__cxx11::string&>
                  ("%s: has both \"R\", \"G\", and \"B\" or \"Y\" channels.",&texname);
      }
      PVar12.super_Tuple2<pbrt::Point2,_int>.y = (int)t.m.m[0][2];
      PVar12.super_Tuple2<pbrt::Point2,_int>.x = (int)t.m.m[0][1];
      local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"Y","");
      channels.n = 1;
      channels.ptr = &local_4e8;
      Image::Image((Image *)&finalRenderFromLight,(PixelFormat)FVar16,PVar12,channels,&local_48,
                   alloc_local);
      image.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)finalRenderFromLight.m.m[0][2];
      image._0_8_ = finalRenderFromLight.m.m[0]._0_8_;
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&image.channelNames,
                  (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(finalRenderFromLight.m.m + 1));
      image.encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )local_418.bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&image.p8,&local_410);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&image.p16,&local_3f0);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&image.p32,&local_3d0);
      local_3d0.nStored = 0;
      (*(local_3d0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_3d0.alloc.memoryResource,local_3d0.ptr,local_3d0.nAlloc << 2,4);
      local_3f0.nStored = 0;
      (*(local_3f0.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_3f0.alloc.memoryResource,local_3f0.ptr,local_3f0.nAlloc * 2,2);
      local_410.nStored = 0;
      (*(local_410.alloc.memoryResource)->_vptr_memory_resource[3])
                (local_410.alloc.memoryResource,local_410.ptr,local_410.nAlloc,1);
      InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(finalRenderFromLight.m.m + 1));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
        operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
      }
      if (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
        local_5a0 = 0;
        do {
          if (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.x) {
            uVar9 = local_5a0 << 0x20;
            uVar15 = 0;
            do {
              PVar12.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar9 | uVar15);
              Image::GetChannels((ImageChannelValues *)&finalRenderFromLight,(Image *)&t,PVar12,
                                 &rgbDesc,(WrapMode2D)0x200000002);
              if (finalRenderFromLight.m.m[2]._8_8_ == 0) {
                fVar17 = 0.0;
              }
              else {
                paFVar8 = (Float (*) [4])
                          CONCAT44(finalRenderFromLight.m.m[0][3],finalRenderFromLight.m.m[0][2]);
                if ((Float (*) [4])
                    CONCAT44(finalRenderFromLight.m.m[0][3],finalRenderFromLight.m.m[0][2]) ==
                    (Float (*) [4])0x0) {
                  paFVar8 = finalRenderFromLight.m.m + 1;
                }
                fVar17 = 0.0;
                lVar14 = 0;
                do {
                  fVar17 = fVar17 + (*paFVar8)[lVar14];
                  lVar14 = lVar14 + 1;
                } while (finalRenderFromLight.m.m[2]._8_8_ != lVar14);
              }
              auVar3 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,finalRenderFromLight.m.m[2]._8_8_);
              Image::SetChannel(&image,PVar12,0,fVar17 / auVar3._0_4_);
              finalRenderFromLight.m.m[2][2] = 0.0;
              finalRenderFromLight.m.m[2][3] = 0.0;
              (**(code **)(*(long *)finalRenderFromLight.m.m[0]._0_8_ + 0x18))
                        (finalRenderFromLight.m.m[0]._0_8_,
                         CONCAT44(finalRenderFromLight.m.m[0][3],finalRenderFromLight.m.m[0][2]),
                         finalRenderFromLight.m.m[2]._0_8_ << 2,4);
              uVar15 = uVar15 + 1;
            } while ((long)uVar15 < (long)image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
          }
          local_5a0 = local_5a0 + 1;
        } while (local_5a0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y);
      }
    }
    yDesc.offset.nStored = 0;
    (*(yDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (yDesc.offset.alloc.memoryResource,yDesc.offset.ptr,yDesc.offset.nAlloc << 2,4);
    rgbDesc.offset.nStored = 0;
    (*(rgbDesc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (rgbDesc.offset.alloc.memoryResource,rgbDesc.offset.ptr,rgbDesc.offset.nAlloc << 2,4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_180.stringVectors._M_t);
    if (local_180.colorSpace.set == true) {
      local_180.colorSpace.set = false;
    }
    if (local_180.MSE.set == true) {
      local_180.MSE.set = false;
    }
    if (local_180.samplesPerPixel.set == true) {
      local_180.samplesPerPixel.set = false;
    }
    if (local_180.fullResolution.set == true) {
      local_180.fullResolution.set = false;
    }
    if (local_180.pixelBounds.set == true) {
      local_180.pixelBounds.set = false;
    }
    if (local_180.NDCFromWorld.set == true) {
      local_180.NDCFromWorld.set = false;
    }
    if (local_180.cameraFromWorld.set == true) {
      local_180.cameraFromWorld.set = false;
    }
    if (local_180.renderTimeSeconds.set == true) {
      local_180.renderTimeSeconds.set = false;
    }
    local_1a0.nStored = 0;
    (*(local_1a0.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1a0.alloc.memoryResource,local_1a0.ptr,local_1a0.nAlloc << 2,4);
    local_1c0.nStored = 0;
    (*(local_1c0.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1c0.alloc.memoryResource,local_1c0.ptr,local_1c0.nAlloc * 2,2);
    local_1e0.nStored = 0;
    (*(local_1e0.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_1e0.alloc.memoryResource,local_1e0.ptr,local_1e0.nAlloc,1);
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(t.m.m + 1));
  }
  local_50 = I.
             super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
             .bits;
  FVar16 = SpectrumToPhotometric((SpectrumHandle *)&local_50);
  sc = sc / FVar16;
  t.m.m[0]._0_8_ = t.m.m + 1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&t,"power","");
  FVar16 = ParameterDictionary::GetOneFloat(parameters,(string *)&t,-1.0);
  if ((Float (*) [4])t.m.m[0]._0_8_ != t.m.m + 1) {
    operator_delete((void *)t.m.m[0]._0_8_,t.m.m[1]._0_8_ + 1);
  }
  iVar5 = image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
  iVar7 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
  fVar17 = 0.0;
  if (0.0 < FVar16) {
    uVar9 = (ulong)(uint)image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
    if (0 < image.resolution.super_Tuple2<pbrt::Point2,_int>.y) {
      fVar17 = (float)image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
      uVar10 = image.resolution.super_Tuple2<pbrt::Point2,_int>.x & 0x7fffffff;
      auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar15 = 0;
      do {
        local_5a0 = CONCAT44(local_5a0._4_4_,auVar22._0_4_);
        fVar18 = sinf((((float)(int)uVar15 + 0.5) * 3.1415927) / fVar17);
        if (iVar7 < 1) {
          auVar22 = ZEXT464((uint)(Float)local_5a0);
        }
        else {
          uVar13 = 0;
          auVar20 = ZEXT464((uint)(Float)local_5a0);
          do {
            local_5a0 = CONCAT44(local_5a0._4_4_,auVar20._0_4_);
            Image::GetChannels((ImageChannelValues *)&t,&image,(Point2i)(uVar15 << 0x20 | uVar13),
                               (WrapMode2D)0x200000000);
            uVar6 = t.m.m[2]._8_8_;
            if (t.m.m[2]._8_8_ == 0) {
              fVar19 = 0.0;
            }
            else {
              paFVar8 = (Float (*) [4])CONCAT44(t.m.m[0][3],t.m.m[0][2]);
              if ((Float (*) [4])CONCAT44(t.m.m[0][3],t.m.m[0][2]) == (Float (*) [4])0x0) {
                paFVar8 = t.m.m + 1;
              }
              fVar19 = 0.0;
              lVar14 = 0;
              do {
                fVar19 = fVar19 + (*paFVar8)[lVar14];
                lVar14 = lVar14 + 1;
              } while (t.m.m[2]._8_8_ != lVar14);
            }
            t.m.m[2][2] = 0.0;
            t.m.m[2][3] = 0.0;
            (**(code **)(*(long *)t.m.m[0]._0_8_ + 0x18))
                      (t.m.m[0]._0_8_,CONCAT44(t.m.m[0][3],t.m.m[0][2]),t.m.m[2]._0_8_ << 2,4);
            auVar3._4_12_ = in_register_000012c4;
            auVar3._0_4_ = in_XMM3_Da;
            auVar3 = vcvtusi2ss_avx512f(auVar3,uVar6);
            auVar21._0_4_ = fVar19 / auVar3._0_4_;
            auVar21._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar3 = vfmadd132ss_fma(auVar21,ZEXT416((uint)(Float)local_5a0),ZEXT416((uint)fVar18));
            auVar22 = ZEXT1664(auVar3);
            uVar13 = uVar13 + 1;
            auVar20 = ZEXT1664(auVar3);
          } while (uVar13 != uVar10);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar9);
      fVar17 = auVar22._0_4_ * 19.73921;
    }
    sc = (FVar16 / (fVar17 / (float)(iVar5 * iVar7))) * sc;
  }
  finalRenderFromLight.m.m[1][1] = 0.0;
  finalRenderFromLight.m.m[1][2] = 1.0;
  finalRenderFromLight.m.m[0][1] = 0.0;
  finalRenderFromLight.m.m[0][2] = 0.0;
  finalRenderFromLight.m.m[0][3] = 0.0;
  finalRenderFromLight.m.m[1][0] = 0.0;
  finalRenderFromLight.m.m[0][0] = 1.0;
  finalRenderFromLight.m.m[1][3] = 0.0;
  finalRenderFromLight.m.m[2][0] = 0.0;
  finalRenderFromLight.m.m[2][1] = 1.0;
  finalRenderFromLight.m.m[2][2] = 0.0;
  finalRenderFromLight.m.m[2][3] = 0.0;
  finalRenderFromLight.m.m[3][0] = 0.0;
  finalRenderFromLight.m.m[3][1] = 0.0;
  finalRenderFromLight.m.m[3][2] = 0.0;
  finalRenderFromLight.m.m[3][3] = 1.0;
  Transform::Transform(&t,&finalRenderFromLight.m);
  Transform::operator*(&finalRenderFromLight,renderFromLight,&t);
  iVar7 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                    (alloc_local.memoryResource,0x270,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::GoniometricLight,pbrt::Transform&,pbrt::MediumHandle&,pbrt::SpectrumHandle&,float&,pbrt::Image,pbrt::RGBColorSpace_const*&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&alloc_local,(GoniometricLight *)CONCAT44(extraout_var,iVar7),&finalRenderFromLight,
             medium,&I,&sc,&image,&imageColorSpace,&alloc_local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)texname._M_dataplus._M_p != &texname.field_2) {
    operator_delete(texname._M_dataplus._M_p,texname.field_2._M_allocated_capacity + 1);
  }
  image.p32.nStored = 0;
  (*(image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
            (image.p32.alloc.memoryResource,image.p32.ptr,image.p32.nAlloc << 2,4);
  image.p16.nStored = 0;
  (*(image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
            (image.p16.alloc.memoryResource,image.p16.ptr,image.p16.nAlloc * 2,2);
  image.p8.nStored = 0;
  (*(image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
            (image.p8.alloc.memoryResource,image.p8.ptr,image.p8.nAlloc,1);
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~InlinedVector(&image.channelNames);
  return (GoniometricLight *)CONCAT44(extraout_var,iVar7);
}

Assistant:

GoniometricLight *GoniometricLight::Create(const Transform &renderFromLight,
                                           MediumHandle medium,
                                           const ParameterDictionary &parameters,
                                           const RGBColorSpace *colorSpace,
                                           const FileLoc *loc, Allocator alloc) {
    SpectrumHandle I = parameters.GetOneSpectrum("I", &colorSpace->illuminant,
                                                 SpectrumType::General, alloc);
    Float sc = parameters.GetOneFloat("scale", 1);

    Image image(alloc);
    const RGBColorSpace *imageColorSpace = nullptr;

    std::string texname = ResolveFilename(parameters.GetOneString("filename", ""));
    if (!texname.empty()) {
        ImageAndMetadata imageAndMetadata = Image::Read(texname, alloc);
        ImageChannelDesc rgbDesc = imageAndMetadata.image.GetChannelDesc({"R", "G", "B"});
        ImageChannelDesc yDesc = imageAndMetadata.image.GetChannelDesc({"Y"});

        imageColorSpace = imageAndMetadata.metadata.GetColorSpace();

        if (rgbDesc) {
            if (yDesc)
                ErrorExit("%s: has both \"R\", \"G\", and \"B\" or \"Y\" "
                          "channels.",
                          texname);
            image = Image(imageAndMetadata.image.Format(),
                          imageAndMetadata.image.Resolution(), {"Y"},
                          imageAndMetadata.image.Encoding(), alloc);
            for (int y = 0; y < image.Resolution().y; ++y)
                for (int x = 0; x < image.Resolution().x; ++x)
                    image.SetChannel(
                        {x, y}, 0,
                        imageAndMetadata.image.GetChannels({x, y}, rgbDesc).Average());
        } else if (yDesc)
            image = imageAndMetadata.image;
        else
            ErrorExit(loc,
                      "%s: has neither \"R\", \"G\", and \"B\" or \"Y\" "
                      "channels.",
                      texname);
    }

    sc /= SpectrumToPhotometric(I);

    Float phi_v = parameters.GetOneFloat("power", -1);
    if (phi_v > 0) {
        WrapMode2D wrapMode(WrapMode::Repeat, WrapMode::Clamp);
        // integrate over speherical coordinates [0,Pi], [0,2pi]
        Float sumY = 0;
        int width = image.Resolution().x, height = image.Resolution().y;
        for (int v = 0; v < height; ++v) {
            Float sinTheta = std::sin(Pi * Float(v + .5f) / Float(height));
            for (int u = 0; u < width; ++u)
                sumY += sinTheta * image.GetChannels({u, v}, wrapMode).Average();
        }
        Float k_e = 2 * Pi * Pi * sumY / (width * height);
        sc *= phi_v / k_e;
    }

    const Float swapYZ[4][4] = {1, 0, 0, 0, 0, 0, 1, 0, 0, 1, 0, 0, 0, 0, 0, 1};
    Transform t(swapYZ);
    Transform finalRenderFromLight = renderFromLight * t;

    return alloc.new_object<GoniometricLight>(finalRenderFromLight, medium, I, sc,
                                              std::move(image), imageColorSpace, alloc);
}